

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_reorder_fold.hpp
# Opt level: O3

void __thiscall
ans_reorder_fold_encode<4U>::~ans_reorder_fold_encode(ans_reorder_fold_encode<4U> *this)

{
  pointer puVar1;
  pointer peVar2;
  
  puVar1 = (this->most_frequent).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->most_frequent).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  puVar1 = (this->mapping).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->mapping).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  peVar2 = (this->table).
           super__Vector_base<enc_entry_reorder_fold,_std::allocator<enc_entry_reorder_fold>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (peVar2 != (pointer)0x0) {
    operator_delete(peVar2,(long)(this->table).
                                 super__Vector_base<enc_entry_reorder_fold,_std::allocator<enc_entry_reorder_fold>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)peVar2);
  }
  puVar1 = (this->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->nfreqs).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
    return;
  }
  return;
}

Assistant:

static ans_reorder_fold_encode create(const uint32_t* in_u32, size_t n)
    {
        ans_reorder_fold_encode model;

        // 1) identify most frequent syms
        uint32_t unmapped_max_sym = 0;
        for (size_t i = 0; i < n; i++) {
            unmapped_max_sym = std::max(in_u32[i], unmapped_max_sym);
        }
        std::vector<std::pair<int64_t, uint32_t>> unmapped_freqs(
            unmapped_max_sym + 1);
        for (size_t i = 0; i < n; i++) {
            unmapped_freqs[in_u32[i]].first--;
            unmapped_freqs[in_u32[i]].second = in_u32[i];
        }
        std::sort(unmapped_freqs.begin(), unmapped_freqs.end());
        model.sigma = 0;
        for (size_t i = 0; i < unmapped_freqs.size(); i++) {
            if (unmapped_freqs[i].first == 0)
                break;
            model.sigma++;
        }
        size_t no_except_thres = 1 << (fidelity + 8 - 1);
        model.mapping.resize(unmapped_max_sym + 1);
        if (model.sigma < no_except_thres) {
            for (size_t i = 0; i < unmapped_max_sym + 1; i++) {
                model.mapping[i] = i;
            }
        } else {
            for (size_t i = 0; i <= unmapped_max_sym; i++) {
                model.mapping[i] = i + no_except_thres;
            }
            for (size_t i = 0; i < no_except_thres; i++) {
                model.mapping[unmapped_freqs[i].second] = i;
                model.most_frequent.push_back(unmapped_freqs[i].second);
            }
        }
        const uint32_t MAX_SIGMA = 1 << (fidelity + 8 + 1);
        std::vector<uint64_t> freqs(MAX_SIGMA, 0);
        uint32_t max_sym = 0;
        for (size_t i = 0; i < n; i++) {
            auto mapped_u32
                = ans_reorder_fold_mapping<fidelity>(model.mapping[in_u32[i]]);
            freqs[mapped_u32]++;
            max_sym = std::max(mapped_u32, max_sym);
        }
        model.nfreqs = adjust_freqs(freqs, max_sym, true);
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0);
        uint64_t cur_base = 0;
        uint64_t tmp = constants::K * constants::RADIX;
        model.table.resize(max_sym + 1);
        for (size_t sym = 0; sym < model.nfreqs.size(); sym++) {
            model.table[sym].freq = model.nfreqs[sym];
            model.table[sym].base = cur_base;
            model.table[sym].sym_upper_bound = tmp * model.nfreqs[sym];
            cur_base += model.nfreqs[sym];
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }